

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<char,_10>::Resize(TPZManVector<char,_10> *this,int64_t newsize)

{
  char *pcVar1;
  ostream *this_00;
  ulong uVar2;
  char *pcVar3;
  long in_RSI;
  TPZManVector<char,_10> *in_RDI;
  int64_t i_1;
  char *newstore;
  int64_t realsize;
  int64_t i;
  long local_30;
  long local_18;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<char>).fNElements) {
    if ((in_RDI->super_TPZVec<char>).fNAlloc < in_RSI) {
      if (in_RSI < 0xb) {
        if ((in_RDI->super_TPZVec<char>).fStore != in_RDI->fExtAlloc) {
          for (local_18 = 0; local_18 < (in_RDI->super_TPZVec<char>).fNElements;
              local_18 = local_18 + 1) {
            in_RDI->fExtAlloc[local_18] = (in_RDI->super_TPZVec<char>).fStore[local_18];
          }
          pcVar3 = (in_RDI->super_TPZVec<char>).fStore;
          if (pcVar3 != (char *)0x0) {
            operator_delete__(pcVar3);
          }
          (in_RDI->super_TPZVec<char>).fStore = in_RDI->fExtAlloc;
        }
        (in_RDI->super_TPZVec<char>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<char>).fNAlloc = 0;
      }
      else {
        uVar2 = ExpandSize(in_RDI,in_RSI);
        pcVar3 = (char *)operator_new__(uVar2);
        for (local_30 = 0; local_30 < (in_RDI->super_TPZVec<char>).fNElements;
            local_30 = local_30 + 1) {
          pcVar3[local_30] = (in_RDI->super_TPZVec<char>).fStore[local_30];
        }
        if (((in_RDI->super_TPZVec<char>).fStore != in_RDI->fExtAlloc) &&
           (pcVar1 = (in_RDI->super_TPZVec<char>).fStore, pcVar1 != (char *)0x0)) {
          operator_delete__(pcVar1);
        }
        (in_RDI->super_TPZVec<char>).fStore = pcVar3;
        (in_RDI->super_TPZVec<char>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<char>).fNAlloc = uVar2;
      }
    }
    else {
      (in_RDI->super_TPZVec<char>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}